

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

connectdata * find_oldest_idle_connection_in_bundle(Curl_easy *data,connectbundle *bundle)

{
  connectdata *pcVar1;
  time_t tVar2;
  timeval newer;
  connectdata *conn;
  connectdata *conn_candidate;
  timeval now;
  time_t score;
  time_t highscore;
  curl_llist_element *curr;
  connectbundle *bundle_local;
  Curl_easy *data_local;
  
  score = -1;
  conn = (connectdata *)0x0;
  newer = curlx_tvnow();
  for (highscore = (time_t)(bundle->conn_list).head; highscore != 0;
      highscore = *(time_t *)(highscore + 0x10)) {
    pcVar1 = *(connectdata **)highscore;
    if (((pcVar1->inuse & 1U) == 0) && (tVar2 = curlx_tvdiff(newer,pcVar1->now), score < tVar2)) {
      conn = pcVar1;
      score = tVar2;
    }
  }
  return conn;
}

Assistant:

static struct connectdata *
find_oldest_idle_connection_in_bundle(struct Curl_easy *data,
                                      struct connectbundle *bundle)
{
  struct curl_llist_element *curr;
  time_t highscore=-1;
  time_t score;
  struct timeval now;
  struct connectdata *conn_candidate = NULL;
  struct connectdata *conn;

  (void)data;

  now = Curl_tvnow();

  curr = bundle->conn_list.head;
  while(curr) {
    conn = curr->ptr;

    if(!conn->inuse) {
      /* Set higher score for the age passed since the connection was used */
      score = Curl_tvdiff(now, conn->now);

      if(score > highscore) {
        highscore = score;
        conn_candidate = conn;
      }
    }
    curr = curr->next;
  }

  return conn_candidate;
}